

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O1

bool __thiscall
OSSLRSA::reconstructKeyPair(OSSLRSA *this,AsymmetricKeyPair **ppKeyPair,ByteString *serialisedData)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  AsymmetricKeyPair *__s;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ByteString dPriv;
  ByteString dPub;
  ByteString local_70;
  ByteString local_48;
  
  if ((ppKeyPair != (AsymmetricKeyPair **)0x0) &&
     (sVar4 = ByteString::size(serialisedData), sVar4 != 0)) {
    ByteString::chainDeserialise(&local_48,serialisedData);
    ByteString::chainDeserialise(&local_70,serialisedData);
    __s = (AsymmetricKeyPair *)operator_new(0x1b8);
    memset(__s,0,0x1b8);
    (__s->super_Serialisable)._vptr_Serialisable = (_func_int **)&PTR_serialise_0019f4c0;
    OSSLRSAPublicKey::OSSLRSAPublicKey((OSSLRSAPublicKey *)(__s + 1));
    OSSLRSAPrivateKey::OSSLRSAPrivateKey((OSSLRSAPrivateKey *)(__s + 0xd));
    iVar3 = (*(__s->super_Serialisable)._vptr_Serialisable[3])(__s);
    bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x50))
                      ((long *)CONCAT44(extraout_var,iVar3),&local_48);
    iVar3 = (*(__s->super_Serialisable)._vptr_Serialisable[5])(__s);
    bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xc0))
                      ((long *)CONCAT44(extraout_var_00,iVar3),&local_70);
    if ((bVar1 & bVar2) == 0) {
      (*(__s->super_Serialisable)._vptr_Serialisable[2])(__s);
    }
    else {
      *ppKeyPair = __s;
    }
    local_70._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_70.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    local_48._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_48.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    return (bool)(bVar1 & bVar2);
  }
  return false;
}

Assistant:

bool OSSLRSA::reconstructKeyPair(AsymmetricKeyPair** ppKeyPair, ByteString& serialisedData)
{
	// Check input
	if ((ppKeyPair == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	ByteString dPub = ByteString::chainDeserialise(serialisedData);
	ByteString dPriv = ByteString::chainDeserialise(serialisedData);

	OSSLRSAKeyPair* kp = new OSSLRSAKeyPair();

	bool rv = true;

	if (!((RSAPublicKey*) kp->getPublicKey())->deserialise(dPub))
	{
		rv = false;
	}

	if (!((RSAPrivateKey*) kp->getPrivateKey())->deserialise(dPriv))
	{
		rv = false;
	}

	if (!rv)
	{
		delete kp;

		return false;
	}

	*ppKeyPair = kp;

	return true;
}